

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QDateTime __thiscall
QLocale::toDateTime(QLocale *this,QString *string,FormatType format,int baseYear)

{
  undefined8 in_RDX;
  FormatType format_00;
  QLocale *in_RSI;
  Data in_RDI;
  long in_FS_OFFSET;
  QString *format_01;
  QString *in_stack_ffffffffffffffb0;
  QLocale *in_stack_ffffffffffffffb8;
  QString local_20;
  long local_8;
  
  format_00 = (FormatType)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  format_01 = &local_20;
  dateTimeFormat(in_RSI,format_00);
  toDateTime(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,format_01,format_00);
  QString::~QString((QString *)0x4cfab2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDateTime)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QLocale::toDateTime(const QString &string, FormatType format, int baseYear) const
{
    return toDateTime(string, dateTimeFormat(format), baseYear);
}